

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_tostring.c
# Opt level: O0

char * mpt_data_tostring(void **from,mpt_type_t type,size_t *len)

{
  long *plVar1;
  long lVar2;
  size_t sVar3;
  int *piVar4;
  void *pvVar5;
  iovec *vec;
  mpt_buffer *b;
  mpt_array *arr;
  char **txt;
  char *base;
  size_t *len_local;
  mpt_type_t type_local;
  void **from_local;
  
  if (type == 0x73) {
    plVar1 = (long *)*from;
    if ((plVar1 == (long *)0x0) || (txt = (char **)*plVar1, txt == (char **)0x0)) {
      txt = (char **)mpt_data_tostring::def;
    }
    if (len != (size_t *)0x0) {
      sVar3 = strlen((char *)txt);
      *len = sVar3;
    }
    if (plVar1 != (long *)0x0) {
      *from = plVar1 + 1;
    }
    from_local = txt;
  }
  else if ((type == 0x802) || (type == 0xb)) {
    plVar1 = (long *)*from;
    if (plVar1 == (long *)0x0) {
      piVar4 = __errno_location();
      *piVar4 = 0x16;
      from_local = (void **)0x0;
    }
    else {
      lVar2 = *plVar1;
      if (lVar2 == 0) {
        piVar4 = __errno_location();
        *piVar4 = 0x5f;
        from_local = (void **)0x0;
      }
      else if ((mpt_data_tostring::traits == (mpt_type_traits *)0x0) &&
              (mpt_data_tostring::traits = mpt_type_traits(99),
              mpt_data_tostring::traits == (mpt_type_traits *)0x0)) {
        piVar4 = __errno_location();
        *piVar4 = 0x5f;
        from_local = (void **)0x0;
      }
      else if (*(mpt_type_traits **)(lVar2 + 8) == mpt_data_tostring::traits) {
        txt = (char **)(lVar2 + 0x20);
        if (len == (size_t *)0x0) {
          if (*(long *)(lVar2 + 0x18) == 0) {
            txt = (char **)mpt_data_tostring::def;
          }
          else {
            pvVar5 = memchr(txt,0,*(size_t *)(lVar2 + 0x18));
            if (pvVar5 == (void *)0x0) {
              piVar4 = __errno_location();
              *piVar4 = 0x16;
              return (char *)0x0;
            }
          }
        }
        else {
          *len = *(size_t *)(lVar2 + 0x18);
        }
        *from = plVar1 + 1;
        from_local = txt;
      }
      else {
        piVar4 = __errno_location();
        *piVar4 = 0x16;
        from_local = (void **)0x0;
      }
    }
  }
  else if (type == 0x43) {
    plVar1 = (long *)*from;
    if (plVar1 == (long *)0x0) {
      piVar4 = __errno_location();
      *piVar4 = 0x16;
      from_local = (void **)0x0;
    }
    else {
      txt = (char **)*plVar1;
      if (txt == (char **)0x0) {
        if (plVar1[1] != 0) {
          piVar4 = __errno_location();
          *piVar4 = 0x16;
          return (char *)0x0;
        }
        txt = (char **)mpt_data_tostring::def;
      }
      if (len == (size_t *)0x0) {
        if ((plVar1[1] == 0) || (*(char *)((long)txt + plVar1[1] + -1) != '\0')) {
          piVar4 = __errno_location();
          *piVar4 = 0x16;
          return (char *)0x0;
        }
      }
      else {
        *len = plVar1[1];
      }
      *from = plVar1 + 2;
      from_local = txt;
    }
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    from_local = (void **)0x0;
  }
  return (char *)from_local;
}

Assistant:

extern const char *mpt_data_tostring(const void **from, MPT_TYPE(type) type, size_t *len)
{
	static const char def[] = "\0";
	const char *base;
	
	/* simple string pointer */
	if (type == 's') {
		const char * const *txt = *from;
		if (!txt || !(base = *txt)) {
			base = def;
		}
		if (len) {
			*len = strlen(base);
		}
		if (txt) {
			*from = txt + 1;
		}
		return base;
	}
	/* text buffer (pointer or tracked reference) */
	if (type == MPT_ENUM(TypeArray)
	 || type == MPT_ENUM(TypeBufferPtr)) {
		static const MPT_STRUCT(type_traits) *traits= 0;
		const MPT_STRUCT(array) *arr;
		const MPT_STRUCT(buffer) *b;
		
		if (!(arr = *from)) {
			errno = EINVAL;
			return 0;
		}
		if (!(b = arr->_buf)) {
			errno = ENOTSUP;
			return 0;
		}
		/* initialize traits binding */
		if (!traits && (!(traits = mpt_type_traits('c')))) {
			errno = ENOTSUP;
			return 0;
		}
		if (b->_content_traits != traits) {
			errno = EINVAL;
			return 0;
		}
		base = (const char *) (b + 1);
		if (len) {
			*len = b->_used;
		}
		else if (!b->_used) {
			base = def;
		}
		else if (!memchr(base, 0, b->_used)) {
			errno = EINVAL;
			return 0;
		}
		*from = arr + 1;
		return base;
	}
	/* vector data with text content */
	if (type == MPT_type_toVector('c')) {
		const struct iovec *vec = *from;
		
		if (!vec) {
			errno = EINVAL;
			return 0;
		}
		if (!(base = vec->iov_base)) {
			if (vec->iov_len) {
				errno = EINVAL;
				return 0;
			}
			base = def;
		}
		if (len) {
			*len = vec->iov_len;
		}
		else if (!vec->iov_len || base[vec->iov_len - 1]) {
			errno = EINVAL;
			return 0;
		}
		*from = vec + 1;
		return base;
	}
	errno = EINVAL;
	return 0;
}